

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O1

void __thiscall CLI::App::_process_config_file(App *this)

{
  bool bVar1;
  Option *pOVar2;
  pointer pbVar3;
  pointer pbVar4;
  bool bVar5;
  bool bVar6;
  char *__s;
  size_t sVar7;
  FileError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config_file;
  string *config_file_00;
  string ename_string;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  config_files;
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  string local_90;
  undefined1 local_70 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  undefined1 local_40 [16];
  
  pOVar2 = this->config_ptr_;
  if (pOVar2 != (Option *)0x0) {
    bVar1 = (pOVar2->super_OptionBase<CLI::Option>).required_;
    pbVar3 = (pOVar2->results_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar4 = (pOVar2->results_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar5 = pbVar3 != pbVar4;
    if ((pbVar3 == pbVar4) && ((pOVar2->envname_)._M_string_length != 0)) {
      local_b0 = local_a0;
      local_a8 = 0;
      local_a0[0] = 0;
      __s = getenv((pOVar2->envname_)._M_dataplus._M_p);
      if (__s != (char *)0x0) {
        local_70._0_8_ = (string *)(local_70 + 0x10);
        sVar7 = strlen(__s);
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_70,__s,__s + sVar7);
        ::std::__cxx11::string::operator=((string *)&local_b0,(string *)local_70);
        if ((string *)local_70._0_8_ != (string *)(local_70 + 0x10)) {
          operator_delete((void *)local_70._0_8_);
        }
      }
      if (local_a8 != 0) {
        pOVar2 = this->config_ptr_;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,local_b0,local_b0 + local_a8);
        Option::_add_result(pOVar2,&local_90,&pOVar2->results_);
        pOVar2->current_option_state_ = parsing;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
      }
      if (local_b0 != local_a0) {
        operator_delete(local_b0);
      }
    }
    Option::run_callback(this->config_ptr_);
    Option::as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_70,this->config_ptr_);
    if ((local_70._0_8_ == local_70._8_8_) || (*(size_type *)(local_70._0_8_ + 8) == 0)) {
      if (bVar1 != false) {
        this_00 = (FileError *)__cxa_allocate_exception(0x38);
        local_50._M_allocated_capacity = (size_type)local_40;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"config file is required but none was given","");
        FileError::FileError(this_00,(string *)&local_50);
        __cxa_throw(this_00,&FileError::typeinfo,Error::~Error);
      }
    }
    else {
      if (local_70._0_8_ != local_70._8_8_) {
        config_file_00 = (string *)local_70._0_8_;
        do {
          bVar6 = _process_config_file(this,config_file_00,(bool)(pbVar3 != pbVar4 | bVar1));
          if (bVar6) {
            bVar5 = true;
          }
          config_file_00 = config_file_00 + 1;
        } while (config_file_00 != (string *)local_70._8_8_);
      }
      if (!bVar5) {
        pOVar2 = this->config_ptr_;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&pOVar2->results_);
        pOVar2->current_option_state_ = parsing;
        pOVar2 = this->config_ptr_;
        bVar1 = pOVar2->force_callback_;
        pOVar2->force_callback_ = false;
        Option::run_callback(pOVar2);
        this->config_ptr_->force_callback_ = bVar1;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_70);
  }
  return;
}

Assistant:

CLI11_INLINE void App::_process_config_file() {
    if(config_ptr_ != nullptr) {
        bool config_required = config_ptr_->get_required();
        auto file_given = config_ptr_->count() > 0;
        if(!(file_given || config_ptr_->envname_.empty())) {
            std::string ename_string = detail::get_environment_value(config_ptr_->envname_);
            if(!ename_string.empty()) {
                config_ptr_->add_result(ename_string);
            }
        }
        config_ptr_->run_callback();

        auto config_files = config_ptr_->as<std::vector<std::string>>();
        bool files_used{file_given};
        if(config_files.empty() || config_files.front().empty()) {
            if(config_required) {
                throw FileError("config file is required but none was given");
            }
            return;
        }
        for(const auto &config_file : config_files) {
            if(_process_config_file(config_file, config_required || file_given)) {
                files_used = true;
            }
        }
        if(!files_used) {
            // this is done so the count shows as 0 if no callbacks were processed
            config_ptr_->clear();
            bool force = config_ptr_->force_callback_;
            config_ptr_->force_callback_ = false;
            config_ptr_->run_callback();
            config_ptr_->force_callback_ = force;
        }
    }
}